

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mimics_pcre.cc
# Opt level: O1

bool __thiscall re2::PCREWalker::ShortVisit(PCREWalker *this,Regexp *re,bool a)

{
  LogMessage LStack_188;
  
  LogMessage::LogMessage
            (&LStack_188,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/mimics_pcre.cc",
             0x2d,3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&LStack_188.str_,"EmptyStringWalker::ShortVisit called",0x24);
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_188);
  return a;
}

Assistant:

bool ShortVisit(Regexp* re, bool a) {
    // Should never be called: we use Walk not WalkExponential.
    LOG(DFATAL) << "EmptyStringWalker::ShortVisit called";
    return a;
  }